

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O1

bool spvReadEnvironmentFromText
               (vector<char,_std::allocator<char>_> *text,spv_target_env_conflict *env)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  byte unaff_BPL;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  pcVar1 = (text->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar6 = (long)(text->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if (uVar6 == 0) {
    bVar7 = false;
  }
  else {
    uVar5 = 0;
    do {
      if (pcVar1[uVar5] == 0x3b) {
        if (uVar5 + 0xd < uVar6) {
          uVar3 = 1;
          do {
            if ("; Version: 1."[uVar3] != pcVar1[uVar3 + uVar5]) goto LAB_0062fb2d;
            uVar3 = uVar3 + 1;
          } while (uVar3 != 0xd);
          uVar3 = 0xd;
LAB_0062fb2d:
          if ((int)uVar3 == 0xd) {
            if (uVar5 + 0xe < uVar6) {
              bVar7 = (int)pcVar1[uVar5 + 0xe] - 0x30U < 10;
            }
            else {
              bVar7 = false;
            }
            uVar4 = (int)pcVar1[uVar5 + 0xd] - 0x30;
            bVar8 = true;
            if (((uVar4 < 10) && (!bVar7)) && (bVar8 = 6 < uVar4, !bVar8)) {
              *env = ordered_universal_envs._M_elems[uVar4];
              unaff_BPL = 1;
            }
            if (!bVar8) {
              bVar7 = false;
              goto LAB_0062fbb6;
            }
          }
          bVar7 = true;
          uVar3 = uVar5 + (uVar3 & 0xffffffff);
          uVar5 = uVar3;
          for (; (uVar3 < uVar6 && (uVar5 = uVar3, pcVar1[uVar3] != '\n')); uVar3 = uVar3 + 1) {
            uVar5 = uVar6;
          }
        }
        else {
          bVar7 = false;
          unaff_BPL = 0;
        }
LAB_0062fbb6:
        if (bVar7) goto LAB_0062fbba;
        iVar2 = 1;
LAB_0062fbc5:
        bVar7 = false;
      }
      else {
        iVar2 = isspace((int)pcVar1[uVar5]);
        if (iVar2 == 0) {
          iVar2 = 2;
          goto LAB_0062fbc5;
        }
LAB_0062fbba:
        iVar2 = 0;
        bVar7 = true;
      }
      if (!bVar7) goto LAB_0062fbdc;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar6);
    iVar2 = 2;
LAB_0062fbdc:
    bVar7 = (bool)(iVar2 != 2 & unaff_BPL);
  }
  return bVar7;
}

Assistant:

bool spvReadEnvironmentFromText(const std::vector<char>& text,
                                spv_target_env* env) {
  // Version is expected to match "; Version: 1.X"
  // Version string must occur in header, that is, initial lines of comments
  // Once a non-comment line occurs, the header has ended
  for (std::size_t i = 0; i < text.size(); ++i) {
    char c = text[i];

    if (c == ';') {
      // Try to match against the expected version string
      constexpr const char* kVersionPrefix = "; Version: 1.";
      constexpr const auto kPrefixLength = 13;
      // 'minor_digit_pos' is the expected position of the version digit.
      const auto minor_digit_pos = i + kPrefixLength;
      if (minor_digit_pos >= text.size()) return false;

      // Match the prefix.
      auto j = 1;
      for (; j < kPrefixLength; ++j) {
        if (kVersionPrefix[j] != text[i + j]) break;
      }
      // j will match the prefix length if all characters before matched
      if (j == kPrefixLength) {
        // This expects only one digit in the minor number.
        static_assert(((spv::Version >> 8) & 0xff) < 10);
        char minor = text[minor_digit_pos];
        char next_char =
            minor_digit_pos + 1 < text.size() ? text[minor_digit_pos + 1] : 0;
        if (std::isdigit(minor) && !std::isdigit(next_char)) {
          const auto index = minor - '0';
          assert(index >= 0);
          if (static_cast<size_t>(index) < ordered_universal_envs.size()) {
            *env = ordered_universal_envs[index];
            return true;
          }
        }
      }

      // If no match, determine whether the header has ended (in which case,
      // assumption has failed.)
      // Skip until the next line.
      i += j;
      for (; i < text.size(); ++i) {
        if (text[i] == '\n') break;
      }
    } else if (!std::isspace(c)) {
      // Allow blanks, but end the search if we find something else.
      break;
    }
  }
  return false;
}